

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O2

bool __thiscall Func::DoSimpleJitDynamicProfile(Func *this)

{
  bool bVar1;
  uint sourceContextId;
  uint functionId;
  
  bVar1 = IsSimpleJit(this);
  if (bVar1) {
    sourceContextId = GetSourceContextId(this->topFunc);
    functionId = GetLocalFunctionId(this->topFunc);
    bVar1 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_01441eb0,SimpleJitDynamicProfilePhase,sourceContextId,
                       functionId);
    if (!bVar1) {
      return (bool)(DAT_01441e6c ^ 1);
    }
  }
  return false;
}

Assistant:

bool
Func::DoSimpleJitDynamicProfile() const
{
    return IsSimpleJit() && !PHASE_OFF(Js::SimpleJitDynamicProfilePhase, GetTopFunc()) && !CONFIG_FLAG(NewSimpleJit);
}